

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

void ImGui_ImplOpenGL2_NewFrame(void)

{
  ImGui_ImplOpenGL2_Data *pIVar1;
  
  pIVar1 = ImGui_ImplOpenGL2_GetBackendData();
  if (pIVar1->FontTexture == 0) {
    ImGui_ImplOpenGL2_CreateFontsTexture();
    if (pIVar1->FontTexture == 0) {
      ImGui_ImplOpenGL2_CreateFontsTexture();
      return;
    }
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL2_NewFrame()
{
    ImGui_ImplOpenGL2_Data* bd = ImGui_ImplOpenGL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "Context or backend not initialized! Did you call ImGui_ImplOpenGL2_Init()?");

    if (!bd->FontTexture)
        ImGui_ImplOpenGL2_CreateDeviceObjects();
    if (!bd->FontTexture)
        ImGui_ImplOpenGL2_CreateFontsTexture();
}